

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  long *plVar2;
  char *pcVar3;
  char *pcVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[34m",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------ Running tests for Player class ------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nTesting ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"constructor",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_Player_Constructor();
  pcVar3 = "\x1b[31mFail";
  pcVar4 = "\x1b[31mFail";
  if (bVar1) {
    pcVar4 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nTesting ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"getOwnedCountries",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_Player_getOwnedCountries(true);
  pcVar4 = "\x1b[31mFail";
  if (bVar1) {
    pcVar4 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nTesting ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"getCards",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_Player_getHand(true);
  pcVar4 = "\x1b[31mFail";
  if (bVar1) {
    pcVar4 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nTesting ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"getDiceRoller",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_Player_getDiceRoller(true);
  pcVar4 = "\x1b[31mFail";
  if (bVar1) {
    pcVar4 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nTesting ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"attack",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_Player_attack();
  pcVar4 = "\x1b[31mFail";
  if (bVar1) {
    pcVar4 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nTesting ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reinforce",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_Player_reinforce(true);
  pcVar4 = "\x1b[31mFail";
  if (bVar1) {
    pcVar4 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nTesting ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"fortify",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"() method: ",0xb);
  bVar1 = test_Player_fortify(true);
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[30m",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {

    std::cout << "\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------ Running tests for Player class ------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m" << std::endl;

    std::cout << assert("Player", "constructor", test_Player_Constructor()) << std::endl;

    std::cout << assert("Player", "getOwnedCountries", test_Player_getOwnedCountries(true)) << std::endl;

    std::cout << assert("Player", "getCards", test_Player_getHand(true)) << std::endl;

    std::cout << assert("Player", "getDiceRoller", test_Player_getDiceRoller(true)) << std::endl;

    std::cout << assert("Player", "attack", test_Player_attack()) << std::endl;

    std::cout << assert("Player", "reinforce", test_Player_reinforce(true)) << std::endl;

    std::cout << assert("Player", "fortify", test_Player_fortify(true)) << std::endl;

}